

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O2

sexp sexp_make_primitive_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp *ppsVar1;
  sexp psVar2;
  long lVar3;
  double *pdVar4;
  anon_union_24768_35_b8e82fc1_for_value *paVar5;
  long lVar6;
  byte bVar7;
  sexp op;
  sexp name;
  sexp e;
  sexp sym;
  undefined1 local_70 [32];
  undefined1 local_50 [32];
  
  bVar7 = 0;
  local_70._0_8_ = &e;
  e = (sexp)&DAT_0000043e;
  local_50._16_8_ = &op;
  op = (sexp)&DAT_0000043e;
  local_50._0_8_ = &sym;
  sym = (sexp)&DAT_0000043e;
  local_70._16_8_ = &name;
  name = (sexp)&DAT_0000043e;
  local_50._24_8_ = local_70;
  local_70._8_8_ = (ctx->value).context.saves;
  local_50._8_8_ = local_50 + 0x10;
  local_70._24_8_ = local_50;
  (ctx->value).context.saves = (sexp_gc_var_t *)(local_70 + 0x10);
  e = sexp_make_null_env_op(ctx,(sexp)local_70._16_8_,local_50._0_8_,(sexp)(local_70 + 0x10));
  lVar6 = 0;
  do {
    if ((&sexp_primitive_opcodes->op_class)[lVar6] == '\0') {
      (ctx->value).context.saves = (sexp_gc_var_t *)local_70._8_8_;
      return e;
    }
    ppsVar1 = &sexp_primitive_opcodes->name;
    op = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
    pdVar4 = (double *)((long)ppsVar1 + lVar6);
    paVar5 = &op->value;
    for (lVar3 = 0xd; lVar3 != 0; lVar3 = lVar3 + -1) {
      paVar5->flonum = *pdVar4;
      pdVar4 = pdVar4 + (ulong)bVar7 * -2 + 1;
      paVar5 = (anon_union_24768_35_b8e82fc1_for_value *)((long)paVar5 + (ulong)bVar7 * -0x10 + 8);
    }
    name = sexp_intern(ctx,(char *)(op->value).type.name,-1);
    psVar2 = sexp_c_string(ctx,(char *)(op->value).type.name,-1);
    (op->value).type.name = psVar2;
    if ((((op->value).opcode.flags & 2) == 0) ||
       (psVar2 = (op->value).type.cpl, psVar2 == (sexp)0x0)) {
      if ((op->value).flonum_bits[0x58] == '\n') {
        psVar2 = sexp_cons_op(ctx,(sexp)0x0,2,name,(sexp)&DAT_0000003e);
        goto LAB_00125918;
      }
    }
    else {
      sym = sexp_intern(ctx,(char *)psVar2,-1);
      psVar2 = sexp_env_ref(ctx,e,sym,(sexp)&DAT_0000003e);
LAB_00125918:
      (op->value).type.cpl = psVar2;
    }
    if (((op->value).flonum_bits[0x58] == '\v') &&
       (psVar2 = (op->value).type.slots, psVar2 != (sexp)0x0)) {
      psVar2 = sexp_c_string(ctx,(char *)psVar2,-1);
      (op->value).type.slots = psVar2;
    }
    sexp_env_define(ctx,e,name,op);
    lVar6 = lVar6 + 0x68;
  } while( true );
}

Assistant:

sexp sexp_make_primitive_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  int i;
  sexp_gc_var4(e, op, sym, name);
  sexp_gc_preserve4(ctx, e, op, sym, name);
  e = sexp_make_null_env(ctx, version);
  for (i=0; sexp_primitive_opcodes[i].op_class; i++) {
    op = sexp_copy_opcode(ctx, &sexp_primitive_opcodes[i]);
    name = sexp_intern(ctx, (char*)sexp_opcode_name(op), -1);
    sexp_opcode_name(op) = sexp_c_string(ctx, (char*)sexp_opcode_name(op), -1);
    if (sexp_opcode_opt_param_p(op) && sexp_opcode_data(op)) {
      sym = sexp_intern(ctx, (char*)sexp_opcode_data(op), -1);
      sexp_opcode_data(op) = sexp_env_ref(ctx, e, sym, SEXP_FALSE);
    } else if (sexp_opcode_class(op) == SEXP_OPC_PARAMETER) {
      sexp_opcode_data(op) = sexp_cons(ctx, name, SEXP_FALSE);
    }
    if (sexp_opcode_class(op) == SEXP_OPC_FOREIGN && sexp_opcode_data2(op)) {
      sexp_opcode_data2(op) = sexp_c_string(ctx, (char*)sexp_opcode_data2(op), -1);
    }
    sexp_env_define(ctx, e, name, op);
  }
  sexp_gc_release4(ctx);
  return e;
}